

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O3

HashTable *
hash_create(void *data,HashTable_HashFn hashfn,HashTable_KeyMatchFn keymatchfn,
           HashTable_NukeFn nukefn,int stackable,MOJOSHADER_malloc m,MOJOSHADER_free f,void *d)

{
  HashTable *pHVar1;
  HashItem **__s;
  
  pHVar1 = (HashTable *)(*m)(0x48,d);
  if (pHVar1 != (HashTable *)0x0) {
    pHVar1->m = (MOJOSHADER_malloc)0x0;
    pHVar1->f = (MOJOSHADER_free)0x0;
    pHVar1->keymatch = (HashTable_KeyMatchFn)0x0;
    pHVar1->nuke = (HashTable_NukeFn)0x0;
    pHVar1->data = (void *)0x0;
    pHVar1->hash = (HashTable_HashFn)0x0;
    pHVar1->table = (HashItem **)0x0;
    pHVar1->table_len = 0;
    pHVar1->stackable = 0;
    pHVar1->d = (void *)0x0;
    __s = (HashItem **)(*m)(0x800,d);
    pHVar1->table = __s;
    if (__s != (HashItem **)0x0) {
      memset(__s,0,0x800);
      pHVar1->table_len = 0x100;
      pHVar1->stackable = stackable;
      pHVar1->data = data;
      pHVar1->hash = hashfn;
      pHVar1->keymatch = keymatchfn;
      pHVar1->nuke = nukefn;
      pHVar1->m = m;
      pHVar1->f = f;
      pHVar1->d = d;
      return pHVar1;
    }
    (*f)(pHVar1,d);
  }
  return (HashTable *)0x0;
}

Assistant:

HashTable *hash_create(void *data, const HashTable_HashFn hashfn,
              const HashTable_KeyMatchFn keymatchfn,
              const HashTable_NukeFn nukefn,
              const int stackable,
              MOJOSHADER_malloc m, MOJOSHADER_free f, void *d)
{
    const uint32 initial_table_size = 256;
    const uint32 alloc_len = sizeof (HashItem *) * initial_table_size;
    HashTable *table = (HashTable *) m(sizeof (HashTable), d);
    if (table == NULL)
        return NULL;
    memset(table, '\0', sizeof (HashTable));

    table->table = (HashItem **) m(alloc_len, d);
    if (table->table == NULL)
    {
        f(table, d);
        return NULL;
    } // if

    memset(table->table, '\0', alloc_len);
    table->table_len = initial_table_size;
    table->stackable = stackable;
    table->data = data;
    table->hash = hashfn;
    table->keymatch = keymatchfn;
    table->nuke = nukefn;
    table->m = m;
    table->f = f;
    table->d = d;
    return table;
}